

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference ppMVar4;
  size_type sVar5;
  ostream *in_RSI;
  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  *in_RDI;
  size_t i;
  char *sep;
  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  *in_stack_ffffffffffffff80;
  Message *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  size_type __n;
  char *local_40;
  
  bVar1 = std::
          vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
          ::empty(in_stack_ffffffffffffff80);
  if (bVar1) {
    std::operator<<(in_RSI,"isn\'t empty");
  }
  else {
    sVar2 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size(in_RDI);
    if (sVar2 == 1) {
      std::operator<<(in_RSI,"doesn\'t have ");
      Elements(in_stack_ffffffffffffffb8);
      poVar3 = testing::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffa8);
      std::operator<<(poVar3,", or has ");
      Elements(in_stack_ffffffffffffffb8);
      poVar3 = testing::operator<<((ostream *)in_RDI,(Message *)poVar3);
      std::operator<<(poVar3," that ");
      Message::~Message((Message *)0x16a32e);
      Message::~Message((Message *)0x16a33b);
      ppMVar4 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::operator[](in_RDI,0);
      (*(*ppMVar4)->_vptr_MatcherDescriberInterface[3])(*ppMVar4,in_RSI);
    }
    else {
      std::operator<<(in_RSI,"doesn\'t have ");
      std::
      vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
      ::size(in_RDI);
      Elements(in_stack_ffffffffffffffb8);
      poVar3 = testing::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffa8);
      std::operator<<(poVar3,", or there exists no permutation of elements such that:\n");
      Message::~Message((Message *)0x16a401);
      local_40 = "";
      sVar2 = 0;
      while( true ) {
        __n = sVar2;
        sVar5 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::size(in_RDI);
        if (sVar2 == sVar5) break;
        poVar3 = std::operator<<(in_RSI,local_40);
        poVar3 = std::operator<<(poVar3," - element #");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,__n);
        std::operator<<(poVar3," ");
        ppMVar4 = std::
                  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ::operator[](in_RDI,__n);
        (*(*ppMVar4)->_vptr_MatcherDescriberInterface[2])(*ppMVar4,in_RSI);
        local_40 = ", and\n";
        sVar2 = __n + 1;
      }
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "isn't empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "doesn't have " << Elements(1)
        << ", or has " << Elements(1) << " that ";
    matcher_describers_[0]->DescribeNegationTo(os);
    return;
  }
  *os << "doesn't have " << Elements(matcher_describers_.size())
      << ", or there exists no permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}